

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

int av1_get_rdmult_delta(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,int orig_rdmult)

{
  byte right_shift;
  byte bVar1;
  byte bVar2;
  int stride;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int mi_col_00;
  int iVar8;
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  long *in_RDI;
  int in_R8D;
  int rdmult;
  double rk;
  double r0;
  double beta;
  int64_t mc_dep_delta;
  TplDepStats *this_stats;
  int col;
  int row;
  int col_step_sr;
  int row_step;
  int step;
  int mi_cols_sr;
  int mi_col_end_sr;
  int mi_col_sr;
  int tpl_stride;
  TplDepStats *tpl_stats;
  TplDepFrame *tpl_frame;
  int mi_high;
  int mi_wide;
  int64_t mc_dep_cost;
  int64_t intra_cost;
  uint8_t block_mis_log2;
  TplParams *tpl_data;
  int tpl_idx;
  GF_GROUP *gf_group;
  AV1_COMMON *cm;
  int local_e4;
  int local_e0;
  int local_d8;
  int local_94;
  int local_90;
  int local_4;
  
  lVar3 = *in_RDI;
  right_shift = *(byte *)(*in_RDI + 0xd2ac);
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_SIL];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_SIL];
  stride = *(int *)(*(long *)(*in_RDI + 0x12298) +
                    (long)(int)(uint)*(byte *)(in_RDI + 0xe258) * 0x60 + 0x40);
  iVar4 = av1_tpl_stats_ready((TplParams *)(*in_RDI + 0xd2a8),(uint)*(byte *)(in_RDI + 0xe258));
  local_4 = in_R8D;
  if ((iVar4 != 0) &&
     (iVar4 = is_frame_tpl_eligible((GF_GROUP *)(lVar3 + 400),(uint8_t)in_RDI[0xe258]), iVar4 != 0))
  {
    iVar5 = coded_to_superres_mi(in_ECX,(uint)*(byte *)(in_RDI + 0x77fa));
    iVar6 = coded_to_superres_mi(in_ECX + (uint)bVar1,(uint)*(byte *)(in_RDI + 0x77fa));
    iVar7 = av1_pixels_to_mi((int)in_RDI[0x77f9]);
    mi_col_00 = 1 << (right_shift & 0x1f);
    iVar4 = mi_col_00;
    iVar8 = coded_to_superres_mi(mi_col_00,(uint)*(byte *)(in_RDI + 0x77fa));
    for (local_90 = in_EDX; local_94 = iVar5, local_90 < (int)(in_EDX + (uint)bVar2);
        local_90 = mi_col_00 + local_90) {
      for (; local_94 < iVar6; local_94 = iVar8 + local_94) {
        if ((local_90 < *(int *)((long)in_RDI + 0x3c194)) && (local_94 < iVar7)) {
          av1_tpl_ptr_pos(local_90,local_94,stride,right_shift);
        }
      }
    }
    local_d8 = av1_get_adaptive_rdmult
                         ((AV1_COMP *)CONCAT44(iVar6,iVar7),(double)CONCAT44(iVar4,mi_col_00));
    if ((in_R8D * 3) / 2 <= local_d8) {
      local_d8 = (in_R8D * 3) / 2;
    }
    if (in_R8D / 2 < local_d8) {
      local_e0 = local_d8;
    }
    else {
      local_e0 = in_R8D / 2;
    }
    if (local_e0 < 1) {
      local_e4 = 1;
    }
    else {
      local_e4 = local_e0;
    }
    local_4 = local_e4;
  }
  return local_4;
}

Assistant:

int av1_get_rdmult_delta(AV1_COMP *cpi, BLOCK_SIZE bsize, int mi_row,
                         int mi_col, int orig_rdmult) {
  AV1_COMMON *const cm = &cpi->common;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  int64_t intra_cost = 0;
  int64_t mc_dep_cost = 0;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  int tpl_stride = tpl_frame->stride;

  if (!av1_tpl_stats_ready(&cpi->ppi->tpl_data, cpi->gf_frame_index)) {
    return orig_rdmult;
  }
  if (!is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) {
    return orig_rdmult;
  }

#ifndef NDEBUG
  int mi_count = 0;
#endif
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int step = 1 << block_mis_log2;
  const int row_step = step;
  const int col_step_sr =
      coded_to_superres_mi(step, cm->superres_scale_denominator);
  for (int row = mi_row; row < mi_row + mi_high; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      if (row >= cm->mi_params.mi_rows || col >= mi_cols_sr) continue;
      TplDepStats *this_stats =
          &tpl_stats[av1_tpl_ptr_pos(row, col, tpl_stride, block_mis_log2)];
      int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      intra_cost += this_stats->recrf_dist << RDDIV_BITS;
      mc_dep_cost += (this_stats->recrf_dist << RDDIV_BITS) + mc_dep_delta;
#ifndef NDEBUG
      mi_count++;
#endif
    }
  }
  assert(mi_count <= MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);

  double beta = 1.0;
  if (mc_dep_cost > 0 && intra_cost > 0) {
    const double r0 = cpi->rd.r0;
    const double rk = (double)intra_cost / mc_dep_cost;
    beta = (r0 / rk);
  }

  int rdmult = av1_get_adaptive_rdmult(cpi, beta);

  rdmult = AOMMIN(rdmult, orig_rdmult * 3 / 2);
  rdmult = AOMMAX(rdmult, orig_rdmult * 1 / 2);

  rdmult = AOMMAX(1, rdmult);

  return rdmult;
}